

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getCount(int element,int *count,Network *nw)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  Node *node_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Node_*,_std::allocator<Node_*>_> *__range2_1;
  Node *node;
  iterator __end2;
  iterator __begin2;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  int err;
  Network *nw_local;
  int *count_local;
  int element_local;
  
  __range2._4_4_ = 0;
  *count = 0;
  switch(element) {
  case 0:
    iVar2 = Network::count(nw,NODE);
    *count = iVar2;
    break;
  case 1:
    __end2 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&nw->nodes);
    node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&nw->nodes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       *)&node), bVar1) {
      ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&__end2);
      iVar2 = (*((*ppNVar3)->super_Element)._vptr_Element[2])();
      if (iVar2 == 1) {
        *count = *count + 1;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&__end2);
    }
    break;
  case 2:
    iVar2 = Network::count(nw,LINK);
    *count = iVar2;
    break;
  case 3:
    iVar2 = Network::count(nw,PATTERN);
    *count = iVar2;
    break;
  case 4:
    iVar2 = Network::count(nw,CURVE);
    *count = iVar2;
    break;
  case 5:
    iVar2 = Network::count(nw,CONTROL);
    *count = iVar2;
    break;
  case 6:
    break;
  case 7:
    __end2_1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&nw->nodes);
    node_1 = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&nw->nodes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                               *)&node_1), bVar1) {
      ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&__end2_1);
      iVar2 = (*((*ppNVar3)->super_Element)._vptr_Element[2])();
      if (iVar2 == 2) {
        *count = *count + 1;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&__end2_1);
    }
    break;
  default:
    __range2._4_4_ = 0xcb;
  }
  return __range2._4_4_;
}

Assistant:

int DataManager::getCount(int element, int* count, Network* nw)
{
    int err = 0;
    *count = 0;
    switch (element)
    {
    case EN_NODECOUNT:    *count = nw->count(Element::NODE); break;
    case EN_LINKCOUNT:    *count = nw->count(Element::LINK); break;
    case EN_PATCOUNT:     *count = nw->count(Element::PATTERN); break;
    case EN_CURVECOUNT:   *count = nw->count(Element::CURVE); break;
    case EN_CONTROLCOUNT: *count = nw->count(Element::CONTROL); break;
    case EN_RULECOUNT:    break;
    case EN_TANKCOUNT:
        for (Node* node : nw->nodes) if ( node->type() == Node::TANK ) (*count)++;
        break;
    case EN_RESVCOUNT:
        for (Node* node : nw->nodes) if ( node->type() == Node::RESERVOIR ) (*count)++;
         break;
    default: err = 203;
    }
    return err;
}